

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnnoise_demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  DenoiseState *st_00;
  FILE *__stream;
  FILE *__s;
  short local_b88 [4];
  short tmp [480];
  DenoiseState *st;
  FILE *fout;
  FILE *f1;
  float x [480];
  int local_1c;
  int first;
  int i;
  char **argv_local;
  int argc_local;
  
  bVar1 = true;
  st_00 = rnnoise_create((RNNModel *)0x0);
  if (argc == 3) {
    __stream = fopen(argv[1],"rb");
    __s = fopen(argv[2],"wb");
    while( true ) {
      fread(local_b88,2,0x1e0,__stream);
      iVar2 = feof(__stream);
      if (iVar2 != 0) break;
      for (local_1c = 0; local_1c < 0x1e0; local_1c = local_1c + 1) {
        x[(long)local_1c + -2] = (float)(int)local_b88[local_1c];
      }
      rnnoise_process_frame(st_00,(float *)&f1,(float *)&f1);
      for (local_1c = 0; local_1c < 0x1e0; local_1c = local_1c + 1) {
        local_b88[local_1c] = (short)(int)x[(long)local_1c + -2];
      }
      if (!bVar1) {
        fwrite(local_b88,2,0x1e0,__s);
      }
      bVar1 = false;
    }
    rnnoise_destroy(st_00);
    fclose(__stream);
    fclose(__s);
    argv_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"usage: %s <noisy speech> <output denoised>\n",*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int first = 1; // 标记是否是第一帧pcm
    float x[FRAME_SIZE];
    FILE *f1, *fout;
    DenoiseState *st;
    st = rnnoise_create(NULL);
    if (argc != 3) {
        fprintf(stderr, "usage: %s <noisy speech> <output denoised>\n", argv[0]);
        return 1;
    }
    f1 = fopen(argv[1], "rb");
    fout = fopen(argv[2], "wb");
    while (1) {
        short tmp[FRAME_SIZE];
        fread(tmp, sizeof(short), FRAME_SIZE, f1); // 从文件流中读数据
        if (feof(f1)) break; // 达到文件结尾
        for (i = 0; i < FRAME_SIZE; i++) x[i] = tmp[i];
        rnnoise_process_frame(st, x, x);
        for (i = 0; i < FRAME_SIZE; i++) tmp[i] = x[i];
        if (!first) fwrite(tmp, sizeof(short), FRAME_SIZE, fout);
        // 第一帧不处理不保存, 从第二帧开始保存, out文件自然会少一帧, 但不影响PESQ的测试
        // 一帧480个采样点,每个采样点short类型的2字节，少的一帧就是960字节
        first = 0;
    }
    rnnoise_destroy(st);
    fclose(f1);
    fclose(fout);
    return 0;
}